

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLatch.c
# Opt level: O0

int Abc_NtkCountSelfFeedLatches(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Obj_t *pObj;
  int local_20;
  int local_1c;
  int Counter;
  int i;
  Abc_Obj_t *pLatch;
  Abc_Ntk_t *pNtk_local;
  
  local_20 = 0;
  for (local_1c = 0; iVar1 = Vec_PtrSize(pNtk->vBoxes), local_1c < iVar1; local_1c = local_1c + 1) {
    pObj = Abc_NtkBox(pNtk,local_1c);
    iVar1 = Abc_ObjIsLatch(pObj);
    if (iVar1 != 0) {
      iVar1 = Abc_NtkLatchIsSelfFeed(pObj);
      local_20 = iVar1 + local_20;
    }
  }
  return local_20;
}

Assistant:

int Abc_NtkCountSelfFeedLatches( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pLatch;
    int i, Counter;
    Counter = 0;
    Abc_NtkForEachLatch( pNtk, pLatch, i )
    {
//        if ( Abc_NtkLatchIsSelfFeed(pLatch) && Abc_ObjFanoutNum(pLatch) > 1 )
//            printf( "Fanouts = %d.\n", Abc_ObjFanoutNum(pLatch) );
        Counter += Abc_NtkLatchIsSelfFeed( pLatch );
    }
    return Counter;
}